

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O3

iterator __thiscall
bssl::anon_unknown_12::ValidPolicyGraph::AddNodeReturningIterator
          (ValidPolicyGraph *this,Input policy,
          vector<bssl::der::Input,_std::allocator<bssl::der::Input>_> *parent_policies)

{
  _Rb_tree_header *p_Var1;
  _Link_type p_Var2;
  size_t *psVar3;
  byte bVar4;
  byte bVar5;
  pointer pmVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  pointer pIVar9;
  bool bVar10;
  _Rb_tree_node_base *this_00;
  long lVar11;
  long lVar12;
  _Base_ptr p_Var13;
  uchar *puVar14;
  _Link_type __p;
  _Link_type p_Var15;
  undefined1 *puVar16;
  _Link_type p_Var17;
  bool bVar18;
  Input rhs;
  
  p_Var13 = (_Base_ptr)policy.data_.size_;
  puVar14 = policy.data_.data_;
  rhs.data_.size_ = 4;
  rhs.data_.data_ = "U\x1d ";
  bVar10 = bssl::der::operator!=(policy,rhs);
  if (!bVar10) {
    __assert_fail("policy != der::Input(kAnyPolicyOid)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x2d0,
                  "Level::iterator bssl::(anonymous namespace)::ValidPolicyGraph::AddNodeReturningIterator(der::Input, std::vector<der::Input>)"
                 );
  }
  pmVar6 = (this->levels_).
           super__Vector_base<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>,_std::allocator<std::map<bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  p_Var7 = (_Base_ptr)
           (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_start;
  p_Var8 = (_Base_ptr)
           (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pIVar9 = (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (parent_policies->super__Vector_base<bssl::der::Input,_std::allocator<bssl::der::Input>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (_Rb_tree_node_base *)operator_new(0x50);
  *(uchar **)(this_00 + 1) = puVar14;
  this_00[1]._M_parent = p_Var13;
  this_00[1]._M_left = p_Var7;
  this_00[1]._M_right = p_Var8;
  *(pointer *)(this_00 + 2) = pIVar9;
  *(undefined2 *)&this_00[2]._M_parent = 0;
  p_Var1 = &pmVar6[-1]._M_t._M_impl.super__Rb_tree_header;
  __p = (_Link_type)pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var17 = (_Link_type)p_Var1;
  if (__p == (_Link_type)0x0) {
LAB_004b7900:
    if (p_Var17 == (_Link_type)pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_header._M_left)
    goto LAB_004b7964;
    lVar11 = ::std::_Rb_tree_decrement(&p_Var17->super__Rb_tree_node_base);
    lVar12 = *(long *)(lVar11 + 0x20);
    lVar11 = *(long *)(lVar11 + 0x28);
  }
  else {
    do {
      while( true ) {
        p_Var17 = __p;
        lVar12 = *(long *)(p_Var17->_M_storage)._M_storage;
        lVar11 = *(long *)((p_Var17->_M_storage)._M_storage + 8);
        bVar10 = lVar11 != 0;
        if ((p_Var13 != (_Base_ptr)0x0) && (lVar11 != 0)) {
          puVar16 = (undefined1 *)0x0;
          do {
            bVar4 = puVar14[(long)puVar16];
            bVar5 = puVar16[lVar12];
            if (bVar4 < bVar5) goto LAB_004b78ea;
            if (bVar4 >= bVar5 && bVar4 != bVar5) goto LAB_004b78f5;
            bVar10 = (undefined1 *)(lVar11 + -1) != puVar16;
          } while (((undefined1 *)((long)&p_Var13[-1]._M_right + 7) != puVar16) &&
                  (bVar18 = (undefined1 *)(lVar11 + -1) != puVar16, puVar16 = puVar16 + 1, bVar18));
        }
        if (!bVar10) break;
LAB_004b78ea:
        __p = (_Link_type)(p_Var17->super__Rb_tree_node_base)._M_left;
        if (__p == (_Link_type)0x0) {
          __p = (_Link_type)0x0;
          goto LAB_004b7900;
        }
      }
LAB_004b78f5:
      __p = (_Link_type)(p_Var17->super__Rb_tree_node_base)._M_right;
    } while (__p != (_Link_type)0x0);
    __p = (_Link_type)0x0;
  }
  bVar10 = p_Var13 != (_Base_ptr)0x0;
  if (lVar11 != 0 && bVar10) {
    p_Var2 = (_Link_type)((long)&p_Var13[-1]._M_right + 7);
    p_Var15 = (_Link_type)0x0;
    do {
      bVar4 = (p_Var15->_M_storage)._M_storage[lVar12 + -0x20];
      bVar5 = puVar14[(long)p_Var15];
      if (bVar4 < bVar5) goto LAB_004b7964;
      __p = p_Var15;
      if (bVar4 >= bVar5 && bVar4 != bVar5) goto LAB_004b79de;
      bVar10 = p_Var2 != p_Var15;
    } while (((_Link_type)(lVar11 + -1) != p_Var15) &&
            (__p = (_Link_type)((long)&(p_Var15->super__Rb_tree_node_base)._M_color + 1),
            bVar18 = p_Var2 != p_Var15, p_Var15 = __p, bVar18));
  }
  if (!bVar10) {
LAB_004b79de:
    ::std::
    _Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
    ::_M_drop_node((_Rb_tree<bssl::der::Input,_std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>,_std::_Select1st<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>,_std::less<bssl::der::Input>,_std::allocator<std::pair<const_bssl::der::Input,_bssl::(anonymous_namespace)::ValidPolicyGraph::Node>_>_>
                    *)this_00,__p);
    __assert_fail("inserted",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_certificate_chain.cc"
                  ,0x2d6,
                  "Level::iterator bssl::(anonymous namespace)::ValidPolicyGraph::AddNodeReturningIterator(der::Input, std::vector<der::Input>)"
                 );
  }
LAB_004b7964:
  if ((_Link_type)p_Var1 == p_Var17) {
LAB_004b79b1:
    bVar10 = true;
  }
  else {
    lVar12 = *(long *)((p_Var17->_M_storage)._M_storage + 8);
    bVar10 = lVar12 != 0;
    if ((p_Var13 != (_Base_ptr)0x0) && (lVar12 != 0)) {
      puVar16 = (undefined1 *)0x0;
      while( true ) {
        bVar4 = puVar14[(long)puVar16];
        bVar5 = puVar16[*(long *)(p_Var17->_M_storage)._M_storage];
        if (bVar4 < bVar5) goto LAB_004b79b1;
        if (bVar4 >= bVar5 && bVar4 != bVar5) break;
        bVar10 = (undefined1 *)(lVar12 + -1) != puVar16;
        if (((undefined1 *)((long)&p_Var13[-1]._M_right + 7) == puVar16) ||
           (bVar18 = (undefined1 *)(lVar12 + -1) == puVar16, puVar16 = puVar16 + 1, bVar18))
        goto LAB_004b79b3;
      }
      bVar10 = false;
    }
  }
LAB_004b79b3:
  ::std::_Rb_tree_insert_and_rebalance
            (bVar10,this_00,&p_Var17->super__Rb_tree_node_base,&p_Var1->_M_header);
  psVar3 = &pmVar6[-1]._M_t._M_impl.super__Rb_tree_header._M_node_count;
  *psVar3 = *psVar3 + 1;
  return (iterator)this_00;
}

Assistant:

Level::iterator AddNodeReturningIterator(
      der::Input policy, std::vector<der::Input> parent_policies) {
    assert(policy != der::Input(kAnyPolicyOid));
    auto [iter, inserted] = levels_.back().insert(
        std::pair{policy, Node{std::move(parent_policies)}});
    // GCC before 8.1 tracks individual unused bindings and does not support
    // marking them [[maybe_unused]].
    (void)inserted;
    assert(inserted);
    return iter;
  }